

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChParserOpenSim.cpp
# Opt level: O3

void __thiscall chrono::utils::ChParserOpenSim::Report::Print(Report *this)

{
  _Hash_node_base *p_Var1;
  ostream *poVar2;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<chrono::ChBodyAuxRef>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<chrono::ChBodyAuxRef>_>_>_>
  *__range2;
  char *pcVar3;
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Parsed ",7);
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," bodies:\n",9);
  for (p_Var1 = (this->bodies)._M_h._M_before_begin._M_nxt; p_Var1 != (_Hash_node_base *)0x0;
      p_Var1 = p_Var1->_M_nxt) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"   name: \"",10);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,(char *)p_Var1[1]._M_nxt,(long)p_Var1[2]._M_nxt);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\"",1);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Parsed ",7);
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," joints:\n",9);
  for (p_Var1 = (this->joints)._M_h._M_before_begin._M_nxt; p_Var1 != (_Hash_node_base *)0x0;
      p_Var1 = p_Var1->_M_nxt) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"   name: \"",10);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,(char *)p_Var1[1]._M_nxt,(long)p_Var1[2]._M_nxt);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\", type: \"",10);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar2,(char *)p_Var1[5]._M_nxt,(long)p_Var1[6]._M_nxt);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\", standin: ",0xc);
    pcVar3 = "no";
    if ((ulong)*(byte *)&p_Var1[0xb]._M_nxt != 0) {
      pcVar3 = "yes";
    }
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar2,pcVar3,(ulong)*(byte *)&p_Var1[0xb]._M_nxt | 2);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Parsed ",7);
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," forces:\n",9);
  for (p_Var1 = (this->forces)._M_h._M_before_begin._M_nxt; p_Var1 != (_Hash_node_base *)0x0;
      p_Var1 = p_Var1->_M_nxt) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"   name: \"",10);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,(char *)p_Var1[1]._M_nxt,(long)p_Var1[2]._M_nxt);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\", type: \"",10);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar2,(char *)p_Var1[5]._M_nxt,(long)p_Var1[6]._M_nxt);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\"",1);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
  }
  return;
}

Assistant:

void ChParserOpenSim::Report::Print() const {
    std::cout << "Parsed " << bodies.size() << " bodies:\n";
    for (auto const& body : bodies) {
        std::cout << "   name: \"" << body.first << "\"" << std::endl;
    }

    std::cout << "Parsed " << joints.size() << " joints:\n";
    for (auto const& joint : joints) {
        std::cout << "   name: \"" << joint.first << "\", type: \"" << joint.second.type
                  << "\", standin: " << (joint.second.standin ? "yes" : "no") << std::endl;
    }

    std::cout << "Parsed " << forces.size() << " forces:\n";
    for (auto const& force : forces) {
        std::cout << "   name: \"" << force.first << "\", type: \"" << force.second.type << "\"" << std::endl;
    }
}